

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_PlaneSurface::SetDomain(ON_PlaneSurface *this,int dir,double t0,double t1)

{
  bool local_29;
  bool rc;
  double t1_local;
  double t0_local;
  int dir_local;
  ON_PlaneSurface *this_local;
  
  local_29 = false;
  if (((-1 < dir) && (dir < 2)) && (t0 < t1)) {
    local_29 = true;
    ON_Interval::Set((ON_Interval *)(&this->field_0x90 + (long)dir * 0x10),t0,t1);
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  }
  return local_29;
}

Assistant:

bool ON_PlaneSurface::SetDomain( 
  int dir, 
  double t0, 
  double t1
  )
{
  bool rc = false;
  if ( dir >= 0 && dir <= 1 && t0 < t1 )
  {
    rc = true;
    m_domain[dir].Set(t0,t1);
    DestroySurfaceTree();
  }
  return rc;
}